

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O1

int Gia_ManCheckRefinements
              (Gia_Man_t *p,Vec_Str_t *vStatus,Vec_Int_t *vOutputs,Cec_ManSim_t *pSim,int fRings)

{
  long lVar1;
  long lVar2;
  
  if (vStatus->nSize * 2 != vOutputs->nSize) {
    __assert_fail("2 * Vec_StrSize(vStatus) == Vec_IntSize(vOutputs)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                  ,0x268,
                  "int Gia_ManCheckRefinements(Gia_Man_t *, Vec_Str_t *, Vec_Int_t *, Cec_ManSim_t *, int)"
                 );
  }
  if (0 < vStatus->nSize) {
    lVar1 = 1;
    lVar2 = 0;
    do {
      if (((long)vOutputs->nSize <= lVar1 + -1) || (vOutputs->nSize <= lVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vStatus->pArray[lVar2] == -1) {
        Cec_ManSimClassRemoveOne(pSim,vOutputs->pArray[lVar1]);
      }
      else if ((vStatus->pArray[lVar2] == '\0') && (vOutputs->pArray[lVar1] == 0)) {
        __assert_fail("k",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x3c2,"int Gia_ObjHasSameRepr(Gia_Man_t *, int, int)");
      }
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 2;
    } while (lVar2 < vStatus->nSize);
  }
  return 1;
}

Assistant:

int Gia_ManCheckRefinements( Gia_Man_t * p, Vec_Str_t * vStatus, Vec_Int_t * vOutputs, Cec_ManSim_t * pSim, int fRings )
{
    int i, status, iRepr, iObj;
    int Counter = 0;
    assert( 2 * Vec_StrSize(vStatus) == Vec_IntSize(vOutputs) );
    Vec_StrForEachEntry( vStatus, status, i )
    {
        iRepr = Vec_IntEntry( vOutputs, 2*i );
        iObj  = Vec_IntEntry( vOutputs, 2*i+1 );
        if ( status == 1 )
            continue;
        if ( status == 0 )
        {
            if ( Gia_ObjHasSameRepr(p, iRepr, iObj) )
                Counter++;
//            if ( Gia_ObjHasSameRepr(p, iRepr, iObj) )
//                Abc_Print( 1, "Gia_ManCheckRefinements(): Disproved equivalence (%d,%d) is not refined!\n", iRepr, iObj );
//            if ( Gia_ObjHasSameRepr(p, iRepr, iObj) )
//                Cec_ManSimClassRemoveOne( pSim, iObj );
            continue;
        }
        if ( status == -1 )
        {
//            if ( !Gia_ObjFailed( p, iObj ) )
//                Abc_Print( 1, "Gia_ManCheckRefinements(): Failed equivalence is not marked as failed!\n" );
//            Gia_ObjSetFailed( p, iRepr );
//            Gia_ObjSetFailed( p, iObj );        
//            if ( fRings )
//            Cec_ManSimClassRemoveOne( pSim, iRepr );
            Cec_ManSimClassRemoveOne( pSim, iObj );
            continue;
        }
    }
//    if ( Counter )
//    Abc_Print( 1, "Gia_ManCheckRefinements(): Could not refine %d nodes.\n", Counter );
    return 1;
}